

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_wrap.c
# Opt level: O0

void * camellia_ctx_alloc(void)

{
  mbedtls_camellia_context *ctx;
  
  ctx = (mbedtls_camellia_context *)calloc(1,0x114);
  if (ctx == (mbedtls_camellia_context *)0x0) {
    ctx = (mbedtls_camellia_context *)0x0;
  }
  else {
    mbedtls_camellia_init(ctx);
  }
  return ctx;
}

Assistant:

static void * camellia_ctx_alloc( void )
{
    mbedtls_camellia_context *ctx;
    ctx = mbedtls_calloc( 1, sizeof( mbedtls_camellia_context ) );

    if( ctx == NULL )
        return( NULL );

    mbedtls_camellia_init( ctx );

    return( ctx );
}